

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dp.c
# Opt level: O1

DP_WSR_Stream
MpiInitWriterPerReader
          (CP_Services Svcs,DP_WS_Stream WS_Stream_v,int readerCohortSize,CP_PeerCohort PeerCohort,
          void **providedReaderInfo_v,void **WriterContactInfoPtr)

{
  int *piVar1;
  void *pvVar2;
  SMPI_Comm comm;
  long lVar3;
  ulong uVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  byte bVar7;
  int Rank;
  uint local_34;
  
  bVar7 = 0;
  piVar1 = (int *)calloc(0x490,1);
  MPI_Open_port(&ompi_mpi_info_null,piVar1 + 0x20);
  *(DP_WS_Stream *)(piVar1 + 6) = WS_Stream_v;
  *(CP_PeerCohort *)(piVar1 + 2) = PeerCohort;
  *piVar1 = readerCohortSize;
  (*Svcs->verbose)(*WS_Stream_v,5,"MPI dataplane WriterPerReader to be initialized\n");
  pvVar2 = malloc((long)readerCohortSize * 0x48);
  *(void **)(piVar1 + 0x1c) = pvVar2;
  pvVar2 = malloc((long)readerCohortSize * 8);
  *(void **)(piVar1 + 0x1e) = pvVar2;
  if (0 < readerCohortSize) {
    uVar4 = 0;
    do {
      puVar5 = (undefined8 *)providedReaderInfo_v[uVar4];
      puVar6 = (undefined8 *)(uVar4 * 0x48 + *(long *)(piVar1 + 0x1c));
      for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
        *puVar6 = *puVar5;
        puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
        puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
      }
      *(undefined **)(*(long *)(piVar1 + 0x1e) + uVar4 * 8) = &ompi_mpi_comm_null;
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uint)readerCohortSize);
  }
  pthread_mutex_lock((pthread_mutex_t *)((long)WS_Stream_v + 0x78));
  piVar1[0x120] = 0;
  piVar1[0x121] = 0;
  puVar5 = *(undefined8 **)((long)WS_Stream_v + 0x38);
  *(undefined8 **)(piVar1 + 0x122) = puVar5;
  *puVar5 = piVar1;
  *(int **)((long)WS_Stream_v + 0x38) = piVar1 + 0x120;
  pthread_mutex_unlock((pthread_mutex_t *)((long)WS_Stream_v + 0x78));
  comm = (*Svcs->getMPIComm)(*WS_Stream_v);
  SMPI_Comm_rank(comm,(int *)&local_34);
  snprintf((char *)(piVar1 + 8),0x40,"Writer Rank %d, test contact",(ulong)local_34);
  *(int **)(piVar1 + 0x18) = piVar1;
  *(undefined8 *)(piVar1 + 0x1a) = *(undefined8 *)((long)WS_Stream_v + 0x10);
  *WriterContactInfoPtr = piVar1 + 8;
  return piVar1;
}

Assistant:

static DP_WSR_Stream MpiInitWriterPerReader(CP_Services Svcs, DP_WS_Stream WS_Stream_v,
                                            int readerCohortSize, CP_PeerCohort PeerCohort,
                                            void **providedReaderInfo_v,
                                            void **WriterContactInfoPtr)
{
    MpiStreamWR StreamWR = (MpiStreamWR)WS_Stream_v;
    MpiStreamWPR StreamWPR = calloc(sizeof(struct _MpiStreamWPR), 1);
    MpiReaderContactInfo *providedReaderInfo = (MpiReaderContactInfo *)providedReaderInfo_v;

    MPI_Open_port(MPI_INFO_NULL, StreamWPR->MpiPortName);

    StreamWPR->StreamWR = StreamWR; /* pointer to writer struct */
    StreamWPR->Link.PeerCohort = PeerCohort;
    StreamWPR->Link.CohortSize = readerCohortSize;

    Svcs->verbose(StreamWR->Stream.CP_Stream, DPTraceVerbose,
                  "MPI dataplane WriterPerReader to be initialized\n");

    /* * Copy of writer contact information (original will not be preserved) */
    StreamWPR->CohortReaderInfo = malloc(sizeof(struct _MpiReaderContactInfo) * readerCohortSize);
    StreamWPR->CohortMpiComms = malloc(sizeof(MPI_Comm) * readerCohortSize);
    for (int i = 0; i < readerCohortSize; i++)
    {
        memcpy(&StreamWPR->CohortReaderInfo[i], providedReaderInfo[i],
               sizeof(struct _MpiReaderContactInfo));
        StreamWPR->CohortMpiComms[i] = MPI_COMM_NULL;
    }

    pthread_mutex_lock(&StreamWR->MutexReaders);
    TAILQ_INSERT_TAIL(&StreamWR->Readers, StreamWPR, entries);
    pthread_mutex_unlock(&StreamWR->MutexReaders);

    /* Prepare ContactInfo */
    int Rank;
    SMPI_Comm comm = Svcs->getMPIComm(StreamWR->Stream.CP_Stream);
    SMPI_Comm_rank(comm, &Rank);
    snprintf(StreamWPR->MyContactInfo.ContactString, MPI_DP_CONTACT_STRING_LEN,
             "Writer Rank %d, test contact", Rank);

    StreamWPR->MyContactInfo.StreamWPR = StreamWPR;
    StreamWPR->MyContactInfo.taskID = StreamWR->Stream.taskID;
    *WriterContactInfoPtr = &StreamWPR->MyContactInfo;

    return StreamWPR;
}